

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RoboSimian::Output(RoboSimian *this)

{
  __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var1
  ;
  element_type *peVar2;
  iterator pvVar3;
  ostream *poVar4;
  long lVar5;
  double dVar6;
  value_type_conflict v_4;
  iterator __end3_4;
  iterator __begin3_4;
  array<double,_8UL> *__range3_4;
  value_type_conflict v_3;
  iterator __end3_3;
  iterator __begin3_3;
  array<double,_8UL> *__range3_3;
  value_type_conflict v_2;
  iterator __end3_2;
  iterator __begin3_2;
  array<double,_8UL> *__range3_2;
  array<double,_8UL> torques;
  value_type_conflict v_1;
  iterator __end3_1;
  iterator __begin3_1;
  array<double,_8UL> *__range3_1;
  array<double,_8UL> speeds;
  value_type_conflict v;
  iterator __end3;
  iterator __begin3;
  array<double,_8UL> *__range3;
  array<double,_8UL> angles;
  int i;
  RoboSimian *this_local;
  
  for (angles._M_elems[7]._4_4_ = 0; angles._M_elems[7]._4_4_ < 4;
      angles._M_elems[7]._4_4_ = angles._M_elems[7]._4_4_ + 1) {
    lVar5 = (long)angles._M_elems[7]._4_4_;
    dVar6 = ChSystem::GetChTime(this->m_system);
    std::ostream::operator<<((ostream *)(&this->field_0x108 + lVar5 * 0x200),dVar6);
    p_Var1 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                ::operator[](&this->m_limbs,(long)angles._M_elems[7]._4_4_);
    peVar2 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var1);
    RS_Limb::GetMotorAngles((array<double,_8UL> *)&__range3,peVar2);
    __end3 = std::array<double,_8UL>::begin((array<double,_8UL> *)&__range3);
    pvVar3 = std::array<double,_8UL>::end((array<double,_8UL> *)&__range3);
    for (; __end3 != pvVar3; __end3 = __end3 + 1) {
      speeds._M_elems[7] = *__end3;
      poVar4 = std::operator<<((ostream *)
                               (&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),"  ");
      std::ostream::operator<<(poVar4,speeds._M_elems[7]);
    }
    p_Var1 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                ::operator[](&this->m_limbs,(long)angles._M_elems[7]._4_4_);
    peVar2 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var1);
    RS_Limb::GetMotorOmegas((array<double,_8UL> *)&__range3_1,peVar2);
    __end3_1 = std::array<double,_8UL>::begin((array<double,_8UL> *)&__range3_1);
    pvVar3 = std::array<double,_8UL>::end((array<double,_8UL> *)&__range3_1);
    for (; __end3_1 != pvVar3; __end3_1 = __end3_1 + 1) {
      torques._M_elems[7] = *__end3_1;
      poVar4 = std::operator<<((ostream *)
                               (&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),"  ");
      std::ostream::operator<<(poVar4,torques._M_elems[7]);
    }
    p_Var1 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                ::operator[](&this->m_limbs,(long)angles._M_elems[7]._4_4_);
    peVar2 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var1);
    RS_Limb::GetMotorTorques((array<double,_8UL> *)&__range3_2,peVar2);
    __end3_2 = std::array<double,_8UL>::begin((array<double,_8UL> *)&__range3_2);
    pvVar3 = std::array<double,_8UL>::end((array<double,_8UL> *)&__range3_2);
    for (; __end3_2 != pvVar3; __end3_2 = __end3_2 + 1) {
      dVar6 = *__end3_2;
      poVar4 = std::operator<<((ostream *)
                               (&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),"  ");
      std::ostream::operator<<(poVar4,dVar6);
    }
    p_Var1 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                ::operator[](&this->m_limbs,(long)angles._M_elems[7]._4_4_);
    peVar2 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var1);
    RS_Limb::GetMotorActuations
              (peVar2,(array<double,_8UL> *)&__range3,(array<double,_8UL> *)&__range3_1);
    __end3_3 = std::array<double,_8UL>::begin((array<double,_8UL> *)&__range3);
    pvVar3 = std::array<double,_8UL>::end((array<double,_8UL> *)&__range3);
    for (; __end3_3 != pvVar3; __end3_3 = __end3_3 + 1) {
      dVar6 = *__end3_3;
      poVar4 = std::operator<<((ostream *)
                               (&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),"  ");
      std::ostream::operator<<(poVar4,dVar6);
    }
    __end3_4 = std::array<double,_8UL>::begin((array<double,_8UL> *)&__range3_1);
    pvVar3 = std::array<double,_8UL>::end((array<double,_8UL> *)&__range3_1);
    for (; __end3_4 != pvVar3; __end3_4 = __end3_4 + 1) {
      dVar6 = *__end3_4;
      poVar4 = std::operator<<((ostream *)
                               (&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),"  ");
      std::ostream::operator<<(poVar4,dVar6);
    }
    std::ostream::operator<<
              ((ostream *)(&this->field_0x108 + (long)angles._M_elems[7]._4_4_ * 0x200),
               std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RoboSimian::Output() {
    for (int i = 0; i < 4; i++) {
        // Current motor angles
        m_outf[i] << m_system->GetChTime();
        std::array<double, 8> angles = m_limbs[i]->GetMotorAngles();
        for (auto v : angles) {
            m_outf[i] << "  " << v;
        }
        // Current motor angular speeds
        std::array<double, 8> speeds = m_limbs[i]->GetMotorOmegas();
        for (auto v : speeds) {
            m_outf[i] << "  " << v;
        }
        // Current motor (reaction) torques
        std::array<double, 8> torques = m_limbs[i]->GetMotorTorques();
        for (auto v : torques) {
            m_outf[i] << "  " << v;
        }
        // Actuations data
        m_limbs[i]->GetMotorActuations(angles, speeds);
        for (auto v : angles) {
            m_outf[i] << "  " << v;
        }
        for (auto v : speeds) {
            m_outf[i] << "  " << v;
        }
        m_outf[i] << std::endl;
    }
}